

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_ext_dup(lys_module *mod,lys_ext_instance **orig,uint8_t size,void *parent,
               LYEXT_PAR parent_type,lys_ext_instance ***new,unres_schema *unres)

{
  undefined8 *puVar1;
  int iVar2;
  LY_ERR *pLVar3;
  lys_ext_instance **e;
  lys_ext_instance *plVar4;
  char *pcVar5;
  lys_node *snode;
  lyxml_elem *plVar6;
  unres_ext *info_orig;
  unres_ext *info;
  lys_ext_instance **result;
  uint8_t u;
  int i;
  lys_ext_instance ***new_local;
  LYEXT_PAR parent_type_local;
  void *parent_local;
  lys_ext_instance **pplStack_20;
  uint8_t size_local;
  lys_ext_instance **orig_local;
  lys_module *mod_local;
  
  pplStack_20 = orig;
  orig_local = (lys_ext_instance **)mod;
  if (new == (lys_ext_instance ***)0x0) {
    __assert_fail("new",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x507,
                  "int lys_ext_dup(struct lys_module *, struct lys_ext_instance **, uint8_t, void *, LYEXT_PAR, struct lys_ext_instance ***, struct unres_schema *)"
                 );
  }
  if (size == '\0') {
    if (orig == (lys_ext_instance **)0x0) {
      *new = (lys_ext_instance **)0x0;
      mod_local._4_4_ = 0;
    }
    else {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
             ,0x50b);
      mod_local._4_4_ = 1;
    }
  }
  else {
    e = (lys_ext_instance **)calloc((ulong)size,8);
    *new = e;
    for (result._3_1_ = 0; result._3_1_ < size; result._3_1_ = result._3_1_ + 1) {
      if (pplStack_20[result._3_1_] == (lys_ext_instance *)0x0) {
        iVar2 = unres_schema_find(unres,-1,&stack0xffffffffffffffe0,UNRES_EXT);
        if (iVar2 == -1) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                 ,0x53a);
LAB_0017be8f:
          *new = (lys_ext_instance **)0x0;
          lys_extension_instances_free((ly_ctx *)*orig_local,e,(uint)result._3_1_);
          return 1;
        }
        puVar1 = (undefined8 *)unres->str_snode[iVar2];
        snode = (lys_node *)malloc(0x30);
        *(undefined4 *)&snode->dsc = *(undefined4 *)(puVar1 + 1);
        if (*(int *)&snode->dsc == 2) {
          plVar6 = lyxml_dup_elem((ly_ctx *)*orig_local,(lyxml_elem *)*puVar1,(lyxml_elem *)0x0,1);
          snode->name = &plVar6->flags;
        }
        snode->ref = (char *)parent;
        *(lys_ext_instance ***)&snode->flags = orig_local;
        *(LYEXT_PAR *)&snode->ext = parent_type;
        *(byte *)((long)&snode->iffeature + 1) = result._3_1_;
        iVar2 = unres_schema_add_node(*(lys_module **)&snode->flags,unres,new,UNRES_EXT,snode);
        if (iVar2 == -1) goto LAB_0017be8f;
      }
      else {
        if (pplStack_20[result._3_1_]->ext_type == '\0') {
          plVar4 = (lys_ext_instance *)malloc(0x28);
          e[result._3_1_] = plVar4;
        }
        else if (pplStack_20[result._3_1_]->ext_type == '\x01') {
          plVar4 = (lys_ext_instance *)
                   calloc(1,(size_t)pplStack_20[result._3_1_]->def->plugin[1].check_position);
          e[result._3_1_] = plVar4;
          *(undefined4 *)&e[result._3_1_][1].arg_value = 0x10000;
          e[result._3_1_][1].parent = orig_local;
          e[result._3_1_][1].def = *(lys_ext **)(pplStack_20[result._3_1_]->def->plugin + 1);
        }
        e[result._3_1_]->def = pplStack_20[result._3_1_]->def;
        e[result._3_1_]->flags = 0;
        pcVar5 = lydict_insert((ly_ctx *)*orig_local,pplStack_20[result._3_1_]->arg_value,0);
        e[result._3_1_]->arg_value = pcVar5;
        e[result._3_1_]->parent = parent;
        e[result._3_1_]->parent_type = (uint8_t)parent_type;
        e[result._3_1_]->insubstmt = pplStack_20[result._3_1_]->insubstmt;
        e[result._3_1_]->insubstmt_index = pplStack_20[result._3_1_]->insubstmt_index;
        e[result._3_1_]->ext_type = pplStack_20[result._3_1_]->ext_type;
        pplStack_20[result._3_1_]->ext = (lys_ext_instance **)0x0;
        e[result._3_1_]->ext_size = pplStack_20[result._3_1_]->ext_size;
        iVar2 = lys_ext_dup((lys_module *)orig_local,pplStack_20[result._3_1_]->ext,
                            pplStack_20[result._3_1_]->ext_size,e[result._3_1_],LYEXT_PAR_EXTINST,
                            &e[result._3_1_]->ext,unres);
        if (iVar2 != 0) goto LAB_0017be8f;
      }
    }
    mod_local._4_4_ = 0;
  }
  return mod_local._4_4_;
}

Assistant:

int
lys_ext_dup(struct lys_module *mod, struct lys_ext_instance **orig, uint8_t size,
            void *parent, LYEXT_PAR parent_type, struct lys_ext_instance ***new, struct unres_schema *unres)
{
    int i;
    uint8_t u = 0;
    struct lys_ext_instance **result;
    struct unres_ext *info, *info_orig;

    assert(new);

    if (!size) {
        if (orig) {
            LOGINT;
            return EXIT_FAILURE;
        }
        (*new) = NULL;
        return EXIT_SUCCESS;
    }

    (*new) = result = calloc(size, sizeof *result);
    for (u = 0; u < size; u++) {
        /* TODO cover complex extension instances */

        if (orig[u]) {
            /* resolved extension instance, just duplicate it */
            switch(orig[u]->ext_type) {
            case LYEXT_FLAG:
                result[u] = malloc(sizeof(struct lys_ext_instance));
                break;
            case LYEXT_COMPLEX:
                result[u] = calloc(1, ((struct lyext_plugin_complex*)orig[u]->def->plugin)->instance_size);
                ((struct lys_ext_instance_complex*)result[u])->nodetype = LYS_EXT;
                ((struct lys_ext_instance_complex*)result[u])->module = mod;
                ((struct lys_ext_instance_complex*)result[u])->substmt = ((struct lyext_plugin_complex*)orig[u]->def->plugin)->substmt;
                /* TODO duplicate data in extension instance content */
                break;
            }
            /* generic part */
            result[u]->def = orig[u]->def;
            result[u]->flags = 0;
            result[u]->arg_value = lydict_insert(mod->ctx, orig[u]->arg_value, 0);
            result[u]->parent = parent;
            result[u]->parent_type = parent_type;
            result[u]->insubstmt = orig[u]->insubstmt;
            result[u]->insubstmt_index = orig[u]->insubstmt_index;
            result[u]->ext_type = orig[u]->ext_type;

            /* extensions */
            orig[u]->ext = NULL;
            result[u]->ext_size = orig[u]->ext_size;
            if (lys_ext_dup(mod, orig[u]->ext, orig[u]->ext_size, result[u],
                            LYEXT_PAR_EXTINST, &result[u]->ext, unres)) {
                goto error;
            }
        } else {
            /* original extension is not yet resolved, so duplicate it in unres */
            i = unres_schema_find(unres, -1, &orig, UNRES_EXT);
            if (i == -1) {
                /* extension not found in unres */
                LOGINT;
                goto error;
            }
            info_orig = unres->str_snode[i];
            info = malloc(sizeof *info);
            info->datatype = info_orig->datatype;
            if (info->datatype == LYS_IN_YIN) {
                info->data.yin = lyxml_dup_elem(mod->ctx, info_orig->data.yin, NULL, 1);
            } /* else TODO YANG */
            info->parent = parent;
            info->mod = mod;
            info->parent_type = parent_type;
            info->ext_index = u;
            if (unres_schema_add_node(info->mod, unres, new, UNRES_EXT, (struct lys_node *)info) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;

error:
    (*new) = NULL;
    lys_extension_instances_free(mod->ctx, result, u);
    return EXIT_FAILURE;
}